

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  int iVar2;
  long *in_RSI;
  long *in_RDI;
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  int k;
  int r;
  int nbits;
  int temp2;
  int temp;
  huff_entropy_ptr entropy;
  undefined8 in_stack_ffffffffffffffb8;
  long lVar3;
  huff_entropy_ptr in_stack_ffffffffffffffc0;
  huff_entropy_ptr entropy_00;
  int in_stack_ffffffffffffffc8;
  uint code;
  int iVar4;
  int local_28;
  int local_24;
  int local_1c;
  
  lVar1 = in_RDI[0x46];
  *(undefined8 *)(lVar1 + 200) = *(undefined8 *)in_RDI[5];
  *(undefined8 *)(lVar1 + 0xd0) = *(undefined8 *)(in_RDI[5] + 8);
  if ((*(int *)((long)in_RDI + 0x13c) != 0) && (*(int *)(lVar1 + 0x38) == 0)) {
    emit_restart_e(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  iVar4 = (int)in_RDI[0x3a];
  code = *(uint *)(in_RDI + 0x3b);
  entropy_00 = (huff_entropy_ptr)in_RDI[0x3c];
  lVar3 = *in_RSI;
  local_28 = 0;
  for (iVar2 = *(int *)((long)in_RDI + 0x1cc); iVar2 <= iVar4; iVar2 = iVar2 + 1) {
    local_1c = (int)*(short *)(lVar3 + (long)(entropy_00->saved).last_dc_val[(long)iVar2 + -9] * 2);
    if (local_1c == 0) {
      local_28 = local_28 + 1;
    }
    else {
      if (local_1c < 0) {
        local_1c = -local_1c >> ((byte)code & 0x1f);
      }
      else {
        local_1c = local_1c >> ((byte)code & 0x1f);
      }
      if (local_1c == 0) {
        local_28 = local_28 + 1;
      }
      else {
        if (*(int *)(lVar1 + 0xe4) != 0) {
          emit_eobrun(entropy_00);
        }
        for (; 0xf < local_28; local_28 = local_28 + -0x10) {
          emit_ac_symbol(entropy_00,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
        }
        local_24 = 1;
        while (local_1c = local_1c >> 1, local_1c != 0) {
          local_24 = local_24 + 1;
        }
        if (10 < local_24) {
          *(undefined4 *)(*in_RDI + 0x28) = 6;
          (**(code **)*in_RDI)(in_RDI);
        }
        emit_ac_symbol(entropy_00,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
        emit_bits_e((huff_entropy_ptr)CONCAT44(iVar2,iVar4),code,in_stack_ffffffffffffffc8);
        local_28 = 0;
      }
    }
  }
  if ((0 < local_28) &&
     (*(int *)(lVar1 + 0xe4) = *(int *)(lVar1 + 0xe4) + 1, *(int *)(lVar1 + 0xe4) == 0x7fff)) {
    emit_eobrun(entropy_00);
  }
  *(undefined8 *)in_RDI[5] = *(undefined8 *)(lVar1 + 200);
  *(undefined8 *)(in_RDI[5] + 8) = *(undefined8 *)(lVar1 + 0xd0);
  if (*(int *)((long)in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar1 + 0x38) == 0) {
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)((long)in_RDI + 0x13c);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x3c) + 1;
      *(uint *)(lVar1 + 0x3c) = *(uint *)(lVar1 + 0x3c) & 7;
    }
    *(int *)(lVar1 + 0x38) = *(int *)(lVar1 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);		/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 0);
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  arith_encode(cinfo, st + 1, 1);
	  arith_encode(cinfo, entropy->fixed_bin, 1);
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
	arith_encode(cinfo, st, 1);
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}